

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *this_00;
  cmTargetExport *targetExport;
  cmGeneratorTarget *target;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  uint uVar6;
  cmExportSet *pcVar7;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *this_01;
  pointer pcVar8;
  ostream *poVar9;
  string *psVar10;
  reference ppcVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  reference pbVar13;
  pair<std::_Rb_tree_const_iterator<cmGeneratorTarget_*>,_bool> pVar14;
  bool local_5d5;
  bool local_57d;
  string *c_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string *c;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_4c0 [6];
  bool result;
  allocator<char> local_499;
  string local_498;
  cmValue local_478;
  bool local_469;
  undefined1 local_468 [7];
  bool newCMP0022Behavior;
  string errorMessage;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  undefined1 local_330 [8];
  ImportPropertyMap properties;
  TargetType targetType;
  cmGeneratorTarget *gt;
  cmTargetExport *te_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *__range1_1;
  bool requiresConfigFiles;
  bool require3_1_0;
  bool require3_0_0;
  bool require2_8_12;
  undefined1 local_2a8 [8];
  ostringstream e;
  pointer local_130;
  _Base_ptr local_128;
  undefined1 local_120;
  _Base_ptr local_118;
  undefined1 local_110;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  reference local_a8;
  unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *te;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *__range1;
  string sep;
  string expectedTargets;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostream *os_local;
  cmExportInstallFileGenerator *this_local;
  
  std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::vector
            ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
             ((long)&expectedTargets.field_2 + 8));
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range1);
  pcVar7 = cmInstallExportGenerator::GetExportSet(this->IEGen);
  this_01 = cmExportSet::GetTargetExports(pcVar7);
  __end1 = std::
           vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ::begin(this_01);
  te = (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
       std::
       vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
       ::end(this_01);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                                     *)&te), bVar3) {
    local_a8 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
               ::operator*(&__end1);
    pcVar8 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                       (local_a8);
    if ((pcVar8->NamelinkOnly & 1U) == 0) {
      std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     &(this->super_cmExportFileGenerator).Namespace);
      pcVar8 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (local_a8);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_108,pcVar8->Target);
      std::operator+(&local_c8,&local_e8,&local_108);
      std::__cxx11::string::operator+=((string *)(sep.field_2._M_local_buf + 8),(string *)&local_c8)
      ;
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::operator=((string *)&__range1," ");
      pcVar8 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (local_a8);
      pVar14 = std::
               set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
               ::insert(&(this->super_cmExportFileGenerator).ExportedTargets,&pcVar8->Target);
      local_128 = (_Base_ptr)pVar14.first._M_node;
      local_120 = pVar14.second;
      local_118 = local_128;
      local_110 = local_120;
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
        poVar9 = std::operator<<((ostream *)local_2a8,"install(EXPORT \"");
        pcVar7 = cmInstallExportGenerator::GetExportSet(this->IEGen);
        psVar10 = cmExportSet::GetName_abi_cxx11_(pcVar7);
        poVar9 = std::operator<<(poVar9,(string *)psVar10);
        poVar9 = std::operator<<(poVar9,"\" ...) ");
        poVar9 = std::operator<<(poVar9,"includes target \"");
        pcVar8 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                           (local_a8);
        psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar8->Target);
        poVar9 = std::operator<<(poVar9,(string *)psVar10);
        std::operator<<(poVar9,"\" more than once in the export set.");
        std::__cxx11::ostringstream::str();
        cmSystemTools::Error((string *)&requiresConfigFiles);
        std::__cxx11::string::~string((string *)&requiresConfigFiles);
        this_local._7_1_ = 0;
        bVar3 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
        goto LAB_00888975;
      }
      local_130 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::get
                            (local_a8);
      std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::push_back
                ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                 ((long)&expectedTargets.field_2 + 8),&local_130);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
    ::operator++(&__end1);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])
            (this,os,(undefined1 *)((long)&sep.field_2 + 8));
  bVar3 = false;
LAB_00888975:
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
  if (!bVar3) {
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x17])(this,os);
    bVar2 = false;
    bVar1 = false;
    bVar3 = false;
    local_57d = false;
    this_00 = (vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
              ((long)&expectedTargets.field_2 + 8);
    __end1_1 = std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(this_00);
    te_1 = (cmTargetExport *)
           std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(this_00);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                               *)&te_1), bVar4) {
      ppcVar11 = __gnu_cxx::
                 __normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                 ::operator*(&__end1_1);
      targetExport = *ppcVar11;
      target = targetExport->Target;
      properties._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           GetExportTargetType(this,targetExport);
      local_57d = local_57d ||
                  properties._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ !=
                  INTERFACE_LIBRARY;
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                (this,os,target,
                 (ulong)properties._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_330);
      cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_330,targetExport);
      cmExportFileGenerator::PopulateSourcesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (ImportPropertyMap *)local_330);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_351);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_350,target,InstallInterface,
                 (ImportPropertyMap *)local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"INTERFACE_COMPILE_DEFINITIONS",&local_379);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_378,target,InstallInterface,
                 (ImportPropertyMap *)local_330);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator(&local_379);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"INTERFACE_COMPILE_OPTIONS",&local_3a1);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3a0,target,InstallInterface,
                 (ImportPropertyMap *)local_330);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::allocator<char>::~allocator(&local_3a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,"INTERFACE_PRECOMPILE_HEADERS",&local_3c9);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3c8,target,InstallInterface,
                 (ImportPropertyMap *)local_330);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator(&local_3c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f0,"INTERFACE_AUTOUIC_OPTIONS",&local_3f1);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3f0,target,InstallInterface,
                 (ImportPropertyMap *)local_330);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator(&local_3f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_418,"INTERFACE_COMPILE_FEATURES",&local_419);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_418,target,InstallInterface,
                 (ImportPropertyMap *)local_330);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator(&local_419);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,"INTERFACE_LINK_OPTIONS",
                 (allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf));
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_440,target,InstallInterface,
                 (ImportPropertyMap *)local_330);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator((allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf))
      ;
      cmExportFileGenerator::PopulateLinkDirectoriesInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (ImportPropertyMap *)local_330);
      cmExportFileGenerator::PopulateLinkDependsInterface
                (&this->super_cmExportFileGenerator,target,InstallInterface,
                 (ImportPropertyMap *)local_330);
      std::__cxx11::string::string((string *)local_468);
      bVar4 = cmExportFileGenerator::PopulateExportProperties
                        (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)local_330,
                         (string *)local_468);
      if (bVar4) {
        PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
        local_5d5 = false;
        if (PVar5 != WARN) {
          PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
          local_5d5 = PVar5 != OLD;
        }
        local_469 = local_5d5;
        if (((local_5d5 != false) &&
            (bVar4 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                               (&this->super_cmExportFileGenerator,target,InstallInterface,
                                (ImportPropertyMap *)local_330), bVar4)) &&
           (((this->super_cmExportFileGenerator).ExportOld & 1U) == 0)) {
          bVar2 = true;
        }
        if (properties._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == INTERFACE_LIBRARY)
        {
          bVar1 = true;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_498,"INTERFACE_SOURCES",&local_499);
        local_478 = cmGeneratorTarget::GetProperty(target,&local_498);
        bVar4 = cmValue::operator_cast_to_bool(&local_478);
        std::__cxx11::string::~string((string *)&local_498);
        std::allocator<char>::~allocator(&local_499);
        if (bVar4) {
          bVar3 = true;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4c0,"INTERFACE_POSITION_INDEPENDENT_CODE",
                   (allocator<char> *)((long)&__range2 + 7));
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_4c0,target,
                   (ImportPropertyMap *)local_330);
        std::__cxx11::string::~string((string *)local_4c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)local_330);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                  (this,target,os,local_330);
        cmExportFileGenerator::GenerateTargetFileSets
                  (&this->super_cmExportFileGenerator,target,os,targetExport);
        bVar4 = false;
      }
      else {
        cmSystemTools::Error((string *)local_468);
        this_local._7_1_ = 0;
        bVar4 = true;
      }
      std::__cxx11::string::~string((string *)local_468);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_330);
      if (bVar4) goto LAB_0088964a;
      __gnu_cxx::
      __normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
      ::operator++(&__end1_1);
    }
    if (bVar3) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,"3.1.0");
    }
    else if (bVar1) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,"3.0.0");
    }
    else if (bVar2) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,"2.8.12");
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x18])(this,os);
    __range2._6_1_ = 1;
    cmExportFileGenerator::GenerateCxxModuleInformation(&this->super_cmExportFileGenerator,os);
    if (local_57d) {
      pvVar12 = &(this->super_cmExportFileGenerator).Configurations;
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar12);
      c = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(pvVar12);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&c), bVar3) {
        pbVar13 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
        bVar3 = GenerateImportCxxModuleConfigTargetInclusion(this,pbVar13);
        if (!bVar3) {
          __range2._6_1_ = 0;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x19])(this,os);
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,os);
    if (local_57d) {
      pvVar12 = &(this->super_cmExportFileGenerator).Configurations;
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar12);
      c_1 = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(pvVar12);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&c_1), bVar3) {
        pbVar13 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
        uVar6 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x1a])
                          (this,pbVar13);
        if ((uVar6 & 1) == 0) {
          __range2._6_1_ = 0;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os);
    this_local._7_1_ = __range2._6_1_ & 1;
  }
LAB_0088964a:
  std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~vector
            ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
             ((long)&expectedTargets.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (std::unique_ptr<cmTargetExport> const& te :
         this->IEGen->GetExportSet()->GetTargetExports()) {
      if (te->NamelinkOnly) {
        continue;
      }
      expectedTargets += sep + this->Namespace + te->Target->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te.get());
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (cmTargetExport* te : allTargets) {
    cmGeneratorTarget* gt = te->Target;
    cmStateEnums::TargetType targetType = this->GetExportTargetType(te);

    requiresConfigFiles =
      requiresConfigFiles || targetType != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt, targetType);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties, *te);
    this->PopulateSourcesInterface(gt, cmGeneratorExpression::InstallInterface,
                                   properties);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_PRECOMPILE_HEADERS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateLinkDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);
    this->PopulateLinkDependsInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gt, properties, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (targetType == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);

    this->GenerateTargetFileSets(gt, os, te);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  bool result = true;

  this->GenerateCxxModuleInformation(os);
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportCxxModuleConfigTargetInclusion(c)) {
        result = false;
      }
    }
  }

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportFileConfig(c)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os);

  return result;
}